

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

XMLElement * CMU462::Collada::ColladaParser::get_technique_common(XMLElement *xml)

{
  int iVar1;
  XMLElement *pXVar2;
  char *__s;
  XMLElement *pXVar3;
  XMLElement *this;
  XMLElement *unaff_R15;
  string sid;
  allocator<char> local_59;
  XMLElement *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pXVar2 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"profile_COMMON");
  if (pXVar2 != (XMLElement *)0x0) {
    local_58 = xml;
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar2->super_XMLNode,"technique");
    do {
      this = pXVar2;
      pXVar3 = unaff_R15;
      if (this == (XMLElement *)0x0) break;
      __s = tinyxml2::XMLElement::Attribute(this,"sid",(char *)0x0);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_59);
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      pXVar3 = this;
      pXVar2 = this;
      if (iVar1 != 0) {
        pXVar2 = tinyxml2::XMLNode::NextSiblingElement(&this->super_XMLNode,"technique");
        pXVar3 = unaff_R15;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      unaff_R15 = pXVar3;
    } while (iVar1 != 0);
    xml = local_58;
    if (this != (XMLElement *)0x0) {
      return pXVar3;
    }
  }
  pXVar2 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"technique_common");
  return pXVar2;
}

Assistant:

XMLElement* ColladaParser::get_technique_common( XMLElement* xml ) {

  XMLElement* common_profile = xml->FirstChildElement("profile_COMMON");
  if (common_profile) {
    XMLElement* technique = common_profile->FirstChildElement("technique");
    while (technique) {
      string sid = technique->Attribute("sid");
      if (sid == "common") return technique;
      technique = technique->NextSiblingElement("technique");
    }
  }

  return xml->FirstChildElement("technique_common");

}